

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

void __thiscall
kj::ArrayBuilder<capnp::Text::Reader>::dispose(ArrayBuilder<capnp::Text::Reader> *this)

{
  Reader *firstElement;
  RemoveConst<capnp::Text::Reader> *pRVar1;
  Reader *pRVar2;
  Reader *endCopy;
  Reader *posCopy;
  Reader *ptrCopy;
  ArrayBuilder<capnp::Text::Reader> *this_local;
  
  firstElement = this->ptr;
  pRVar1 = this->pos;
  pRVar2 = this->endPtr;
  if (firstElement != (Reader *)0x0) {
    this->ptr = (Reader *)0x0;
    this->pos = (RemoveConst<capnp::Text::Reader> *)0x0;
    this->endPtr = (Reader *)0x0;
    ArrayDisposer::dispose<capnp::Text::Reader>
              (this->disposer,firstElement,(long)pRVar1 - (long)firstElement >> 4,
               (long)pRVar2 - (long)firstElement >> 4);
  }
  return;
}

Assistant:

inline void dispose() {
    // Make sure that if an exception is thrown, we are left with a null ptr, so we won't possibly
    // dispose again.
    T* ptrCopy = ptr;
    T* posCopy = pos;
    T* endCopy = endPtr;
    if (ptrCopy != nullptr) {
      ptr = nullptr;
      pos = nullptr;
      endPtr = nullptr;
      disposer->dispose(ptrCopy, posCopy - ptrCopy, endCopy - ptrCopy);
    }
  }